

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum_core.cpp
# Opt level: O2

void mbedtls_mpi_core_shift_r(mbedtls_mpi_uint *X,size_t limbs,size_t count)

{
  byte bVar1;
  ulong uVar2;
  mbedtls_mpi_uint *pmVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  
  uVar4 = count >> 6;
  bVar1 = (byte)count & 0x3f;
  uVar2 = limbs - uVar4;
  if ((uVar4 <= limbs) && ((count & 0x3f) == 0 || uVar2 != 0)) {
    pmVar3 = X;
    uVar5 = uVar2;
    if (0x3f < count) {
      while (uVar5 != 0) {
        *pmVar3 = pmVar3[uVar4];
        pmVar3 = pmVar3 + 1;
        uVar5 = uVar5 - 1;
      }
      for (; uVar2 < limbs; uVar2 = uVar2 + 1) {
        X[uVar2] = 0;
      }
    }
    if ((count & 0x3f) != 0) {
      uVar2 = 0;
      while (bVar6 = limbs != 0, limbs = limbs - 1, bVar6) {
        uVar4 = X[limbs];
        X[limbs] = uVar4 >> bVar1 | uVar2;
        uVar2 = uVar4 << (0x40 - bVar1 & 0x3f);
      }
    }
    return;
  }
  switchD_014c3389::default(X,0,limbs << 3);
  return;
}

Assistant:

void mbedtls_mpi_core_shift_r(mbedtls_mpi_uint *X, size_t limbs,
                              size_t count)
{
    size_t i, v0, v1;
    mbedtls_mpi_uint r0 = 0, r1;

    v0 = count /  biL;
    v1 = count & (biL - 1);

    if (v0 > limbs || (v0 == limbs && v1 > 0)) {
        memset(X, 0, limbs * ciL);
        return;
    }

    /*
     * shift by count / limb_size
     */
    if (v0 > 0) {
        for (i = 0; i < limbs - v0; i++) {
            X[i] = X[i + v0];
        }

        for (; i < limbs; i++) {
            X[i] = 0;
        }
    }

    /*
     * shift by count % limb_size
     */
    if (v1 > 0) {
        for (i = limbs; i > 0; i--) {
            r1 = X[i - 1] << (biL - v1);
            X[i - 1] >>= v1;
            X[i - 1] |= r0;
            r0 = r1;
        }
    }
}